

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_exp_param_t * get_scaled_exp_params(vrna_md_t *md,double pfs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vrna_exp_param_t *pvVar4;
  char *pcVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2e8;
  double local_2d8;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_288;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_200;
  double local_1f0;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a0;
  double local_190;
  double local_188;
  double local_178;
  double local_168;
  double local_158;
  double local_148;
  double local_140;
  double local_108;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int local_6c;
  int local_68;
  int n;
  int m_1;
  int m;
  double GQuadBeta_T;
  double GQuadAlpha_T;
  vrna_exp_param_t *pf;
  double GT;
  double TT;
  double kT;
  uint local_28;
  int pf_smooth;
  uint l;
  uint k;
  uint j;
  uint i;
  double pfs_local;
  vrna_md_t *md_local;
  
  pvVar4 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memset(pvVar4->param_file,0,0x100);
  pcVar5 = last_parameter_file();
  if (pcVar5 != (char *)0x0) {
    pcVar5 = last_parameter_file();
    strncpy(pvVar4->param_file,pcVar5,0xff);
  }
  memcpy(&pvVar4->model_details,md,0x7e8);
  pvVar4->temperature = md->temperature;
  pvVar4->alpha = md->betaScale;
  dVar7 = md->betaScale * (md->temperature + 273.15) * 1.98717;
  pvVar4->kT = dVar7;
  pvVar4->pf_scale = pfs;
  iVar1 = md->pf_smooth;
  dVar8 = (md->temperature + 273.15) / Tmeasure;
  pvVar4->lxc = lxc37 * dVar8;
  if (iVar1 == 0) {
    local_80 = (double)(int)(-(double)(DuplexInitdH - DuplexInit37) * dVar8 + (double)DuplexInitdH);
  }
  else {
    local_80 = -(double)(DuplexInitdH - DuplexInit37) * dVar8 + (double)DuplexInitdH;
  }
  dVar9 = exp((-local_80 * 10.0) / dVar7);
  pvVar4->expDuplexInit = dVar9;
  if (iVar1 == 0) {
    local_88 = (double)(int)(-(double)(TerminalAUdH - TerminalAU37) * dVar8 + (double)TerminalAUdH);
  }
  else {
    local_88 = -(double)(TerminalAUdH - TerminalAU37) * dVar8 + (double)TerminalAUdH;
  }
  dVar9 = exp((-local_88 * 10.0) / dVar7);
  pvVar4->expTermAU = dVar9;
  if (iVar1 == 0) {
    local_90 = (double)(int)(-(double)(ML_BASEdH - ML_BASE37) * dVar8 + (double)ML_BASEdH);
  }
  else {
    local_90 = -(double)(ML_BASEdH - ML_BASE37) * dVar8 + (double)ML_BASEdH;
  }
  dVar9 = exp((-local_90 * 10.0) / dVar7);
  pvVar4->expMLbase = dVar9;
  if (iVar1 == 0) {
    local_98 = (double)(int)(-(double)(ML_closingdH - ML_closing37) * dVar8 + (double)ML_closingdH);
  }
  else {
    local_98 = -(double)(ML_closingdH - ML_closing37) * dVar8 + (double)ML_closingdH;
  }
  dVar9 = exp((-local_98 * 10.0) / dVar7);
  pvVar4->expMLclosing = dVar9;
  if (iVar1 == 0) {
    local_a0 = (double)(int)(-(double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar8 +
                            (double)GQuadLayerMismatchH);
  }
  else {
    local_a0 = -(double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar8 +
               (double)GQuadLayerMismatchH;
  }
  dVar9 = exp((-local_a0 * 10.0) / dVar7);
  pvVar4->expgquadLayerMismatch = dVar9;
  pvVar4->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  for (k = 2; k < 8; k = k + 1) {
    for (l = 3; l < 0x2e; l = l + 1) {
      dVar9 = (double)GQuadAlphadH;
      iVar2 = GQuadAlphadH - GQuadAlpha37;
      dVar10 = (double)GQuadBetadH;
      iVar3 = GQuadBetadH - GQuadBeta37;
      dVar11 = log((double)l - 2.0);
      local_c0 = (dVar9 - (double)iVar2 * dVar8) * (double)(k - 1) +
                 (dVar10 - (double)iVar3 * dVar8) * dVar11;
      if (iVar1 == 0) {
        local_c0 = (double)(int)local_c0;
      }
      dVar9 = exp((-local_c0 * 10.0) / dVar7);
      pvVar4->expgquad[k][l] = dVar9;
    }
  }
  for (k = 0; k < 0x1f; k = k + 1) {
    if (iVar1 == 0) {
      local_c8 = (double)(int)(-(double)(hairpindH[k] - hairpin37[k]) * dVar8 + (double)hairpindH[k]
                              );
    }
    else {
      local_c8 = -(double)(hairpindH[k] - hairpin37[k]) * dVar8 + (double)hairpindH[k];
    }
    dVar9 = exp((-local_c8 * 10.0) / dVar7);
    pvVar4->exphairpin[k] = dVar9;
  }
  for (k = 0; k < 0x1f; k = k + 1) {
    if (iVar1 == 0) {
      local_d0 = (double)(int)(-(double)(bulgedH[k] - bulge37[k]) * dVar8 + (double)bulgedH[k]);
    }
    else {
      local_d0 = -(double)(bulgedH[k] - bulge37[k]) * dVar8 + (double)bulgedH[k];
    }
    dVar9 = exp((-local_d0 * 10.0) / dVar7);
    pvVar4->expbulge[k] = dVar9;
    if (iVar1 == 0) {
      local_d8 = (double)(int)(-(double)(internal_loopdH[k] - internal_loop37[k]) * dVar8 +
                              (double)internal_loopdH[k]);
    }
    else {
      local_d8 = -(double)(internal_loopdH[k] - internal_loop37[k]) * dVar8 +
                 (double)internal_loopdH[k];
    }
    dVar9 = exp((-local_d8 * 10.0) / dVar7);
    pvVar4->expinternal[k] = dVar9;
  }
  if (james_rule != 0) {
    dVar9 = exp(-800.0 / dVar7);
    pvVar4->expinternal[2] = dVar9;
  }
  dVar9 = -(double)(bulgedH[0x1e] - bulge37[0x1e]) * dVar8 + (double)bulgedH[0x1e];
  for (k = 0x1f; k < 0x1f; k = k + 1) {
    if (iVar1 == 0) {
      dVar10 = pvVar4->lxc;
      dVar11 = log((double)k / 30.0);
      local_e0 = (double)(int)(dVar10 * dVar11 + dVar9);
    }
    else {
      dVar10 = pvVar4->lxc;
      dVar11 = log((double)k / 30.0);
      local_e0 = dVar10 * dVar11 + dVar9;
    }
    dVar10 = exp((-local_e0 * 10.0) / dVar7);
    pvVar4->expbulge[k] = dVar10;
  }
  dVar9 = -(double)(internal_loopdH[0x1e] - internal_loop37[0x1e]) * dVar8 +
          (double)internal_loopdH[0x1e];
  for (k = 0x1f; k < 0x1f; k = k + 1) {
    if (iVar1 == 0) {
      dVar10 = pvVar4->lxc;
      dVar11 = log((double)k / 30.0);
      local_108 = (double)(int)(dVar10 * dVar11 + dVar9);
    }
    else {
      dVar10 = pvVar4->lxc;
      dVar11 = log((double)k / 30.0);
      local_108 = dVar10 * dVar11 + dVar9;
    }
    dVar10 = exp((-local_108 * 10.0) / dVar7);
    pvVar4->expinternal[k] = dVar10;
  }
  dVar9 = -(double)(niniodH - ninio37) * dVar8 + (double)niniodH;
  for (l = 0; l < 0x1f; l = l + 1) {
    local_140 = dVar9;
    if (iVar1 == 0) {
      local_140 = (double)(int)dVar9;
    }
    if ((double)l * local_140 <= (double)MAX_NINIO) {
      local_158 = dVar9;
      if (iVar1 == 0) {
        local_158 = (double)(int)dVar9;
      }
      local_148 = (double)l * local_158;
    }
    else {
      local_148 = (double)MAX_NINIO;
    }
    dVar10 = exp((-local_148 * 10.0) / dVar7);
    pvVar4->expninio[2][l] = dVar10;
  }
  for (k = 0; sVar6 = strlen(Tetraloops), k * 7 < sVar6; k = k + 1) {
    if (iVar1 == 0) {
      local_168 = (double)(int)(-(double)(TetraloopdH[k] - Tetraloop37[k]) * dVar8 +
                               (double)TetraloopdH[k]);
    }
    else {
      local_168 = -(double)(TetraloopdH[k] - Tetraloop37[k]) * dVar8 + (double)TetraloopdH[k];
    }
    dVar9 = exp((-local_168 * 10.0) / dVar7);
    pvVar4->exptetra[k] = dVar9;
  }
  for (k = 0; sVar6 = strlen(Triloops), k * 5 < sVar6; k = k + 1) {
    if (iVar1 == 0) {
      local_178 = (double)(int)(-(double)(TriloopdH[k] - Triloop37[k]) * dVar8 +
                               (double)TriloopdH[k]);
    }
    else {
      local_178 = -(double)(TriloopdH[k] - Triloop37[k]) * dVar8 + (double)TriloopdH[k];
    }
    dVar9 = exp((-local_178 * 10.0) / dVar7);
    pvVar4->exptri[k] = dVar9;
  }
  for (k = 0; sVar6 = strlen(Hexaloops), k * 9 < sVar6; k = k + 1) {
    if (iVar1 == 0) {
      local_188 = (double)(int)(-(double)(HexaloopdH[k] - Hexaloop37[k]) * dVar8 +
                               (double)HexaloopdH[k]);
    }
    else {
      local_188 = -(double)(HexaloopdH[k] - Hexaloop37[k]) * dVar8 + (double)HexaloopdH[k];
    }
    dVar9 = exp((-local_188 * 10.0) / dVar7);
    pvVar4->exphex[k] = dVar9;
  }
  for (k = 0; k < 8; k = k + 1) {
    if (iVar1 == 0) {
      local_190 = (double)(int)(-(double)(ML_interndH - ML_intern37) * dVar8 + (double)ML_interndH);
    }
    else {
      local_190 = -(double)(ML_interndH - ML_intern37) * dVar8 + (double)ML_interndH;
    }
    dVar9 = exp((-local_190 * 10.0) / dVar7);
    pvVar4->expMLintern[k] = dVar9;
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      if (md->dangles == 0) {
        pvVar4->expdangle5[k][l] = 1.0;
        pvVar4->expdangle3[k][l] = 1.0;
      }
      else {
        if (iVar1 == 0) {
          if (0.0 <= -(double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                   (double)dangle5_dH[k][l])) {
            local_1a0 = -(double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                      (double)dangle5_dH[k][l]);
          }
          else {
            local_1a0 = 0.0;
          }
          local_1b0 = local_1a0;
        }
        else {
          if (iVar1 == 0) {
            local_1b8 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                     (double)dangle5_dH[k][l]);
          }
          else {
            local_1b8 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                        (double)dangle5_dH[k][l];
          }
          if (-1.2283697 <= -local_1b8 / 10.0) {
            if (iVar1 == 0) {
              local_1c8 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                       (double)dangle5_dH[k][l]);
            }
            else {
              local_1c8 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                          (double)dangle5_dH[k][l];
            }
            if (-local_1c8 / 10.0 <= 0.8660254) {
              if (iVar1 == 0) {
                local_1e0 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                         (double)dangle5_dH[k][l]);
              }
              else {
                local_1e0 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                            (double)dangle5_dH[k][l];
              }
              dVar9 = sin(-local_1e0 / 10.0 - 0.34242663);
              if (iVar1 == 0) {
                local_1f0 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                         (double)dangle5_dH[k][l]);
              }
              else {
                local_1f0 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                            (double)dangle5_dH[k][l];
              }
              dVar10 = sin(-local_1f0 / 10.0 - 0.34242663);
              local_1d8 = (dVar9 + 1.0) * 3.8490018 * (dVar10 + 1.0);
            }
            else {
              if (iVar1 == 0) {
                local_1d0 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                                         (double)dangle5_dH[k][l]);
              }
              else {
                local_1d0 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar8 +
                            (double)dangle5_dH[k][l];
              }
              local_1d8 = -local_1d0;
            }
            local_1c0 = local_1d8;
          }
          else {
            local_1c0 = 0.0;
          }
          local_1b0 = local_1c0;
        }
        dVar9 = exp((local_1b0 * 10.0) / dVar7);
        pvVar4->expdangle5[k][l] = dVar9;
        if (iVar1 == 0) {
          if (0.0 <= -(double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                   (double)dangle3_dH[k][l])) {
            local_200 = -(double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                      (double)dangle3_dH[k][l]);
          }
          else {
            local_200 = 0.0;
          }
          local_210 = local_200;
        }
        else {
          if (iVar1 == 0) {
            local_218 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                     (double)dangle3_dH[k][l]);
          }
          else {
            local_218 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                        (double)dangle3_dH[k][l];
          }
          if (-1.2283697 <= -local_218 / 10.0) {
            if (iVar1 == 0) {
              local_228 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                       (double)dangle3_dH[k][l]);
            }
            else {
              local_228 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                          (double)dangle3_dH[k][l];
            }
            if (-local_228 / 10.0 <= 0.8660254) {
              if (iVar1 == 0) {
                local_240 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                         (double)dangle3_dH[k][l]);
              }
              else {
                local_240 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                            (double)dangle3_dH[k][l];
              }
              dVar9 = sin(-local_240 / 10.0 - 0.34242663);
              if (iVar1 == 0) {
                local_250 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                         (double)dangle3_dH[k][l]);
              }
              else {
                local_250 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                            (double)dangle3_dH[k][l];
              }
              dVar10 = sin(-local_250 / 10.0 - 0.34242663);
              local_238 = (dVar9 + 1.0) * 3.8490018 * (dVar10 + 1.0);
            }
            else {
              if (iVar1 == 0) {
                local_230 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                                         (double)dangle3_dH[k][l]);
              }
              else {
                local_230 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar8 +
                            (double)dangle3_dH[k][l];
              }
              local_238 = -local_230;
            }
            local_220 = local_238;
          }
          else {
            local_220 = 0.0;
          }
          local_210 = local_220;
        }
        dVar9 = exp((local_210 * 10.0) / dVar7);
        pvVar4->expdangle3[k][l] = dVar9;
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      if (iVar1 == 0) {
        local_258 = (double)(int)(-(double)(stackdH[k][l] - stack37[k][l]) * dVar8 +
                                 (double)stackdH[k][l]);
      }
      else {
        local_258 = -(double)(stackdH[k][l] - stack37[k][l]) * dVar8 + (double)stackdH[k][l];
      }
      dVar9 = exp((-local_258 * 10.0) / dVar7);
      pvVar4->expstack[k][l] = dVar9;
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        if (iVar1 == 0) {
          local_260 = (double)(int)(-(double)(mismatchIdH[k][l][(uint)pf_smooth] -
                                             mismatchI37[k][l][(uint)pf_smooth]) * dVar8 +
                                   (double)mismatchIdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_260 = -(double)(mismatchIdH[k][l][(uint)pf_smooth] -
                               mismatchI37[k][l][(uint)pf_smooth]) * dVar8 +
                      (double)mismatchIdH[k][l][(uint)pf_smooth];
        }
        dVar9 = exp((-local_260 * 10.0) / dVar7);
        pvVar4->expmismatchI[k][l][(uint)pf_smooth] = dVar9;
        if (iVar1 == 0) {
          local_268 = (double)(int)(-(double)(mismatch1nIdH[k][l][(uint)pf_smooth] -
                                             mismatch1nI37[k][l][(uint)pf_smooth]) * dVar8 +
                                   (double)mismatch1nIdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_268 = -(double)(mismatch1nIdH[k][l][(uint)pf_smooth] -
                               mismatch1nI37[k][l][(uint)pf_smooth]) * dVar8 +
                      (double)mismatch1nIdH[k][l][(uint)pf_smooth];
        }
        dVar9 = exp((-local_268 * 10.0) / dVar7);
        pvVar4->expmismatch1nI[k][l][(uint)pf_smooth] = dVar9;
        if (iVar1 == 0) {
          local_270 = (double)(int)(-(double)(mismatchHdH[k][l][(uint)pf_smooth] -
                                             mismatchH37[k][l][(uint)pf_smooth]) * dVar8 +
                                   (double)mismatchHdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_270 = -(double)(mismatchHdH[k][l][(uint)pf_smooth] -
                               mismatchH37[k][l][(uint)pf_smooth]) * dVar8 +
                      (double)mismatchHdH[k][l][(uint)pf_smooth];
        }
        dVar9 = exp((-local_270 * 10.0) / dVar7);
        pvVar4->expmismatchH[k][l][(uint)pf_smooth] = dVar9;
        if (iVar1 == 0) {
          local_278 = (double)(int)(-(double)(mismatch23IdH[k][l][(uint)pf_smooth] -
                                             mismatch23I37[k][l][(uint)pf_smooth]) * dVar8 +
                                   (double)mismatch23IdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_278 = -(double)(mismatch23IdH[k][l][(uint)pf_smooth] -
                               mismatch23I37[k][l][(uint)pf_smooth]) * dVar8 +
                      (double)mismatch23IdH[k][l][(uint)pf_smooth];
        }
        dVar9 = exp((-local_278 * 10.0) / dVar7);
        pvVar4->expmismatch23I[k][l][(uint)pf_smooth] = dVar9;
        if (md->dangles == 0) {
          pvVar4->expmismatchExt[k][l][(uint)pf_smooth] = 1.0;
          pvVar4->expmismatchM[k][l][(uint)pf_smooth] = 1.0;
        }
        else {
          if (iVar1 == 0) {
            if (0.0 <= -(double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                               mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                     (double)mismatchMdH[k][l][(uint)pf_smooth])) {
              local_288 = -(double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                  mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                        (double)mismatchMdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_288 = 0.0;
            }
            local_298 = local_288;
          }
          else {
            if (iVar1 == 0) {
              local_2a0 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                 mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                       (double)mismatchMdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_2a0 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                   mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                          (double)mismatchMdH[k][l][(uint)pf_smooth];
            }
            if (-1.2283697 <= -local_2a0 / 10.0) {
              if (iVar1 == 0) {
                local_2b0 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                   mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                         (double)mismatchMdH[k][l][(uint)pf_smooth]);
              }
              else {
                local_2b0 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                            (double)mismatchMdH[k][l][(uint)pf_smooth];
              }
              if (-local_2b0 / 10.0 <= 0.8660254) {
                if (iVar1 == 0) {
                  local_2c8 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                           (double)mismatchMdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_2c8 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                       mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                              (double)mismatchMdH[k][l][(uint)pf_smooth];
                }
                dVar9 = sin(-local_2c8 / 10.0 - 0.34242663);
                if (iVar1 == 0) {
                  local_2d8 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                           (double)mismatchMdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_2d8 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                       mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                              (double)mismatchMdH[k][l][(uint)pf_smooth];
                }
                dVar10 = sin(-local_2d8 / 10.0 - 0.34242663);
                local_2c0 = (dVar9 + 1.0) * 3.8490018 * (dVar10 + 1.0);
              }
              else {
                if (iVar1 == 0) {
                  local_2b8 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                                           (double)mismatchMdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_2b8 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                       mismatchM37[k][l][(uint)pf_smooth]) * dVar8 +
                              (double)mismatchMdH[k][l][(uint)pf_smooth];
                }
                local_2c0 = -local_2b8;
              }
              local_2a8 = local_2c0;
            }
            else {
              local_2a8 = 0.0;
            }
            local_298 = local_2a8;
          }
          dVar9 = exp((local_298 * 10.0) / dVar7);
          pvVar4->expmismatchM[k][l][(uint)pf_smooth] = dVar9;
          if (iVar1 == 0) {
            if (0.0 <= -(double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                               mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                     (double)mismatchExtdH[k][l][(uint)pf_smooth])) {
              local_2e8 = -(double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                  mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                        (double)mismatchExtdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_2e8 = 0.0;
            }
            local_2f8 = local_2e8;
          }
          else {
            if (iVar1 == 0) {
              local_300 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                 mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                       (double)mismatchExtdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_300 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                   mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                          (double)mismatchExtdH[k][l][(uint)pf_smooth];
            }
            if (-1.2283697 <= -local_300 / 10.0) {
              if (iVar1 == 0) {
                local_310 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                   mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                         (double)mismatchExtdH[k][l][(uint)pf_smooth]);
              }
              else {
                local_310 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                            (double)mismatchExtdH[k][l][(uint)pf_smooth];
              }
              if (-local_310 / 10.0 <= 0.8660254) {
                if (iVar1 == 0) {
                  local_328 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                           (double)mismatchExtdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_328 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                       mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                              (double)mismatchExtdH[k][l][(uint)pf_smooth];
                }
                dVar9 = sin(-local_328 / 10.0 - 0.34242663);
                if (iVar1 == 0) {
                  local_338 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                           (double)mismatchExtdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_338 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                       mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                              (double)mismatchExtdH[k][l][(uint)pf_smooth];
                }
                dVar10 = sin(-local_338 / 10.0 - 0.34242663);
                local_320 = (dVar9 + 1.0) * 3.8490018 * (dVar10 + 1.0);
              }
              else {
                if (iVar1 == 0) {
                  local_318 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                                           (double)mismatchExtdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_318 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                       mismatchExt37[k][l][(uint)pf_smooth]) * dVar8 +
                              (double)mismatchExtdH[k][l][(uint)pf_smooth];
                }
                local_320 = -local_318;
              }
              local_308 = local_320;
            }
            else {
              local_308 = 0.0;
            }
            local_2f8 = local_308;
          }
          dVar9 = exp((local_2f8 * 10.0) / dVar7);
          pvVar4->expmismatchExt[k][l][(uint)pf_smooth] = dVar9;
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
          if (iVar1 == 0) {
            local_340 = (double)(int)(-(double)(int11_dH[k][l][(uint)pf_smooth][local_28] -
                                               int11_37[k][l][(uint)pf_smooth][local_28]) * dVar8 +
                                     (double)int11_dH[k][l][(uint)pf_smooth][local_28]);
          }
          else {
            local_340 = -(double)(int11_dH[k][l][(uint)pf_smooth][local_28] -
                                 int11_37[k][l][(uint)pf_smooth][local_28]) * dVar8 +
                        (double)int11_dH[k][l][(uint)pf_smooth][local_28];
          }
          dVar9 = exp((-local_340 * 10.0) / dVar7);
          pvVar4->expint11[k][l][(uint)pf_smooth][local_28] = dVar9;
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
          for (n = 0; n < 5; n = n + 1) {
            if (iVar1 == 0) {
              local_348 = (double)(int)(-(double)(int21_dH[k][l][(uint)pf_smooth][local_28][n] -
                                                 int21_37[k][l][(uint)pf_smooth][local_28][n]) *
                                        dVar8 + (double)int21_dH[k][l][(uint)pf_smooth][local_28][n]
                                       );
            }
            else {
              local_348 = -(double)(int21_dH[k][l][(uint)pf_smooth][local_28][n] -
                                   int21_37[k][l][(uint)pf_smooth][local_28][n]) * dVar8 +
                          (double)int21_dH[k][l][(uint)pf_smooth][local_28][n];
            }
            dVar9 = exp((-local_348 * 10.0) / dVar7);
            pvVar4->expint21[k][l][(uint)pf_smooth][local_28][n] = dVar9;
          }
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
          for (local_68 = 0; local_68 < 5; local_68 = local_68 + 1) {
            for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
              if (iVar1 == 0) {
                local_350 = (double)(int)(-(double)(int22_dH[k][l][(uint)pf_smooth][local_28]
                                                    [local_68][local_6c] -
                                                   int22_37[k][l][(uint)pf_smooth][local_28]
                                                   [local_68][local_6c]) * dVar8 +
                                         (double)int22_dH[k][l][(uint)pf_smooth][local_28][local_68]
                                                 [local_6c]);
              }
              else {
                local_350 = -(double)(int22_dH[k][l][(uint)pf_smooth][local_28][local_68][local_6c]
                                     - int22_37[k][l][(uint)pf_smooth][local_28][local_68][local_6c]
                                     ) * dVar8 +
                            (double)int22_dH[k][l][(uint)pf_smooth][local_28][local_68][local_6c];
              }
              dVar9 = exp((-local_350 * 10.0) / dVar7);
              pvVar4->expint22[k][l][(uint)pf_smooth][local_28][local_68][local_6c] = dVar9;
            }
          }
        }
      }
    }
  }
  strncpy(pvVar4->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar4->Triloops,Triloops,0xf1);
  strncpy(pvVar4->Hexaloops,Hexaloops,0x169);
  return pvVar4;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_scaled_exp_params(vrna_md_t *md,
                      double    pfs)
{
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kT, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));

  memset(pf->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(pf->param_file, last_parameter_file(), 255);

  pf->model_details = *md;
  pf->temperature   = md->temperature;
  pf->alpha         = md->betaScale;
  pf->kT            = kT = md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf->pf_scale      = pfs;
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kT);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kT);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kT);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kT);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kT);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kT);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kT);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kT);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kT);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kT);

  GT = RESCALE_dG(bulge37[30],
                  bulgedH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(internal_loop37[30],
                  internal_loopdH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * TRUNC_MAYBE(GT)) * 10. / kT);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kT);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kT);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kT);

  for (i = 0; i <= NBPAIRS; i++)
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kT);

  /* if dangles==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j]  = RESCALE_BF_SMOOTH(dangle5_37[i][j], dangle5_dH[i][j], TT, kT);
        pf->expdangle3[i][j]  = RESCALE_BF_SMOOTH(dangle3_37[i][j], dangle3_dH[i][j], TT, kT);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j], stackdH[i][j], TT, kT);

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kT);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kT);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kT);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kT);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kT);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kT);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kT);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}